

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

Pattern * __thiscall
InstructionPattern::commonSubPattern(InstructionPattern *this,Pattern *b,int4 sa)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PatternBlock *pPVar2;
  undefined4 extraout_var_02;
  int in_ECX;
  ulong extraout_RDX;
  pointer_____offset_0x10___ *__fn;
  void *in_R8;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long local_98;
  long local_88;
  PatternBlock *c;
  PatternBlock *a;
  PatternBlock *respattern;
  InstructionPattern *b4;
  InstructionPattern *res;
  ContextPattern *b3;
  CombinePattern *b2;
  int4 sa_local;
  Pattern *b_local;
  InstructionPattern *this_local;
  undefined4 extraout_var_01;
  
  __fn = (pointer_____offset_0x10___ *)b;
  iVar1 = (*b->_vptr_Pattern[8])();
  if (iVar1 < 1) {
    if (b == (Pattern *)0x0) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = extraout_RDX;
      auVar3 = auVar3 << 0x40;
    }
    else {
      __fn = &Pattern::typeinfo;
      in_ECX = 0;
      auVar3 = __dynamic_cast(b,&Pattern::typeinfo,&CombinePattern::typeinfo);
    }
    local_88 = auVar3._0_8_;
    if (local_88 == 0) {
      if (b == (Pattern *)0x0) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = auVar3._8_8_;
        auVar4 = auVar4 << 0x40;
      }
      else {
        __fn = &Pattern::typeinfo;
        in_ECX = 0;
        auVar4 = __dynamic_cast(b,&Pattern::typeinfo,&ContextPattern::typeinfo);
      }
      local_98 = auVar4._0_8_;
      if (local_98 == 0) {
        if (sa < 0) {
          iVar1 = PatternBlock::clone(this->maskvalue,(__fn *)__fn,auVar4._8_8_,in_ECX,in_R8);
          pPVar2 = (PatternBlock *)CONCAT44(extraout_var_01,iVar1);
          PatternBlock::shift(pPVar2,-sa);
          a = PatternBlock::commonSubPattern(pPVar2,(PatternBlock *)b[1]._vptr_Pattern);
          if (pPVar2 != (PatternBlock *)0x0) {
            PatternBlock::~PatternBlock(pPVar2);
            operator_delete(pPVar2);
          }
        }
        else {
          iVar1 = PatternBlock::clone((PatternBlock *)b[1]._vptr_Pattern,(__fn *)__fn,auVar4._8_8_,
                                      in_ECX,in_R8);
          pPVar2 = (PatternBlock *)CONCAT44(extraout_var_02,iVar1);
          PatternBlock::shift(pPVar2,sa);
          a = PatternBlock::commonSubPattern(this->maskvalue,pPVar2);
          if (pPVar2 != (PatternBlock *)0x0) {
            PatternBlock::~PatternBlock(pPVar2);
            operator_delete(pPVar2);
          }
        }
        this_local = (InstructionPattern *)operator_new(0x10);
        InstructionPattern(this_local,a);
      }
      else {
        this_local = (InstructionPattern *)operator_new(0x10);
        InstructionPattern(this_local,true);
      }
    }
    else {
      iVar1 = (*b->_vptr_Pattern[6])(b,this,(ulong)(uint)-sa);
      this_local = (InstructionPattern *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  else {
    iVar1 = (*b->_vptr_Pattern[6])(b,this,(ulong)(uint)-sa);
    this_local = (InstructionPattern *)CONCAT44(extraout_var,iVar1);
  }
  return (Pattern *)this_local;
}

Assistant:

Pattern *InstructionPattern::commonSubPattern(const Pattern *b,int4 sa) const

{
  if (b->numDisjoint()>0)
    return b->commonSubPattern(this,-sa);

  const CombinePattern *b2 = dynamic_cast<const CombinePattern *>(b);
  if (b2 != (const CombinePattern *)0)
    return b->commonSubPattern(this,-sa);

  const ContextPattern *b3 = dynamic_cast<const ContextPattern *>(b);
  if (b3 != (const ContextPattern *)0) {
    InstructionPattern *res = new InstructionPattern(true);
    return res;
  }
  const InstructionPattern *b4 = (const InstructionPattern *)b;
  
  PatternBlock *respattern;
  if (sa < 0) {
    PatternBlock *a = maskvalue->clone();
    a->shift(-sa);
    respattern = a->commonSubPattern(b4->maskvalue);
    delete a;
  }
  else {
    PatternBlock *c = b4->maskvalue->clone();
    c->shift(sa);
    respattern = maskvalue->commonSubPattern(c);
    delete c;
  }
  return new InstructionPattern(respattern);
}